

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.h
# Opt level: O2

void __thiscall
QPainter::drawTiledPixmap(QPainter *this,int x,int y,int w,int h,QPixmap *pm,int sx,int sy)

{
  long in_FS_OFFSET;
  double local_28;
  double local_20;
  double local_18;
  double local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = (double)x;
  local_20 = (double)y;
  local_18 = (double)w;
  local_10 = (double)h;
  QPainter::drawTiledPixmap((QRectF *)this,(QPixmap *)&local_28,(QPointF *)pm);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void QPainter::drawTiledPixmap(int x, int y, int w, int h, const QPixmap &pm, int sx, int sy)
{
    drawTiledPixmap(QRectF(x, y, w, h), pm, QPointF(sx, sy));
}